

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O0

int __thiscall
CVmImageLoader::restore_synth_exports(CVmImageLoader *this,CVmFile *fp,CVmObjFixup *fixups)

{
  uint uVar1;
  char *in_RSI;
  long in_RDI;
  vm_val_t val;
  char dh [5];
  char buf [256];
  size_t len;
  long cnt;
  vm_val_t *in_stack_fffffffffffffe68;
  CVmFile *in_stack_fffffffffffffe70;
  CVmHashEntry *in_stack_fffffffffffffe78;
  CVmObjFixup *in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  CVmHashEntryExport *this_00;
  undefined1 local_140 [280];
  CVmHashEntryExport *local_28;
  ulong local_20;
  char *local_10;
  
  local_10 = in_RSI;
  discard_synth_exports((CVmImageLoader *)0x30da9b);
  for (local_20 = CVmFile::read_uint4(in_stack_fffffffffffffe70); local_20 != 0;
      local_20 = local_20 - 1) {
    uVar1 = CVmFile::read_uint2(in_stack_fffffffffffffe70);
    local_28 = (CVmHashEntryExport *)(ulong)uVar1;
    this_00 = local_28;
    if ((CVmHashEntryExport *)0x100 < local_28) {
      this_00 = (CVmHashEntryExport *)0x100;
    }
    CVmFile::read_bytes((CVmFile *)in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78,
                        (size_t)in_stack_fffffffffffffe70);
    if ((CVmHashEntryExport *)0x100 < local_28) {
      in_stack_fffffffffffffe88 = local_10;
      CVmFile::get_pos(in_stack_fffffffffffffe70);
      CVmFile::set_pos(in_stack_fffffffffffffe70,(long)in_stack_fffffffffffffe68);
      local_28 = (CVmHashEntryExport *)0x100;
    }
    in_stack_fffffffffffffe68 = (vm_val_t *)(local_140 + 0x13);
    CVmFile::read_bytes((CVmFile *)in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78,
                        (size_t)in_stack_fffffffffffffe70);
    CVmObjFixup::fix_dh(in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78);
    in_stack_fffffffffffffe78 = (CVmHashEntry *)local_140;
    vmb_get_dh((char *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    in_stack_fffffffffffffe70 = *(CVmFile **)(in_RDI + 0x58);
    in_stack_fffffffffffffe80 = (CVmObjFixup *)operator_new(0x38);
    CVmHashEntryExport::CVmHashEntryExport
              (this_00,in_stack_fffffffffffffe88,(size_t)in_stack_fffffffffffffe80,
               (int)((ulong)in_stack_fffffffffffffe78 >> 0x20),(vm_val_t *)in_stack_fffffffffffffe70
              );
    CVmHashTable::add((CVmHashTable *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  }
  return 0;
}

Assistant:

int CVmImageLoader::restore_synth_exports(VMG_ CVmFile *fp,
                                          CVmObjFixup *fixups)
{
    long cnt;
    
    /* 
     *   discard the old synthesized exports - we want to entirely replace
     *   these with what we're about to load from the file 
     */
    G_image_loader->discard_synth_exports();

    /* read the number of synthesized exports */
    cnt = fp->read_uint4();

    /* read the exports */
    for ( ; cnt != 0 ; --cnt)
    {
        size_t len;
        char buf[256];
        char dh[VMB_DATAHOLDER];
        vm_val_t val;
        
        /* read the length of the name and the name */
        len = fp->read_uint2();
        fp->read_bytes(buf, len > sizeof(buf) ? sizeof(buf) : len);

        /* skip any part of the name that didn't fit in the buffer */
        if (len > sizeof(buf))
        {
            /* skip the extra bytes */
            fp->set_pos(fp->get_pos() + (len - sizeof(buf)));

            /* limit the length we use to the buffer size */
            len = sizeof(buf);
        }

        /* read the value */
        fp->read_bytes(dh, VMB_DATAHOLDER);

        /* if the value is an object reference, fix it up */
        fixups->fix_dh(vmg_ dh);

        /* get the value */
        vmb_get_dh(dh, &val);

        /* add the export */
        synth_exports_->add(new CVmHashEntryExport(buf, len, TRUE, &val));
    }

    /* success */
    return 0;
}